

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teleport.c
# Opt level: O3

boolean enexto_core_range(coord *cc,level *lev,xchar xx,xchar yy,permonst *mdat,uint entflags,
                         int start_range)

{
  bool bVar1;
  int *piVar2;
  boolean bVar3;
  uint uVar4;
  long lVar5;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  long lVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  int x;
  int iVar10;
  xchar *pxVar11;
  coord good [15];
  monst fakemon;
  int local_108;
  int local_104;
  level *local_100;
  xchar local_f8 [44];
  int local_cc;
  coord *local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  ulong local_b0;
  monst local_a8;
  
  local_c0 = CONCAT71(in_register_00000011,xx);
  local_b8 = CONCAT71(in_register_00000009,yy);
  local_a8.data = mons + u.umonster;
  if (mdat != (permonst *)0x0) {
    local_a8.data = mdat;
  }
  local_cc = 0x50;
  local_100 = lev;
  local_c8 = cc;
  if (0x50 < start_range) {
    local_cc = start_range;
  }
  do {
    local_b0 = (ulong)(uint)start_range;
    x = (int)local_c0 - start_range;
    if (x < 2) {
      x = 1;
    }
    local_104 = start_range + (int)local_c0;
    if (0x4e < local_104) {
      local_104 = 0x4f;
    }
    iVar8 = (int)local_b8 - start_range;
    if (iVar8 < 1) {
      iVar8 = 0;
    }
    iVar7 = start_range + (int)local_b8;
    if (0x13 < iVar7) {
      iVar7 = 0x14;
    }
    local_108 = iVar7;
    if (local_104 < x) {
      lVar5 = 0;
    }
    else {
      lVar6 = 0;
      piVar2 = &local_108;
      iVar10 = x;
      do {
        bVar3 = goodpos(local_100,iVar10,iVar8,&local_a8,entflags);
        iVar7 = local_108;
        lVar5 = lVar6;
        if (bVar3 != '\0') {
          local_f8[lVar6] = (xchar)iVar10;
          *(char *)((long)piVar2 + 0x11) = (char)iVar8;
          lVar5 = lVar6 + 2;
          if (lVar6 == 0x1c) goto LAB_002597c7;
        }
        piVar2 = (int *)((long)&local_108 + lVar5);
        bVar1 = iVar10 < local_104;
        lVar6 = lVar5;
        iVar10 = iVar10 + 1;
      } while (bVar1);
      iVar10 = x;
      if (x <= local_104) {
        do {
          bVar3 = goodpos(local_100,iVar10,iVar7,&local_a8,entflags);
          lVar5 = lVar6;
          if (bVar3 != '\0') {
            local_f8[lVar6] = (xchar)iVar10;
            local_f8[lVar6 + 1] = (xchar)iVar7;
            lVar5 = lVar6 + 2;
            if (lVar6 == 0x1c) goto LAB_002597c7;
          }
          bVar1 = iVar10 < local_104;
          lVar6 = lVar5;
          iVar10 = iVar10 + 1;
        } while (bVar1);
      }
    }
    iVar8 = iVar8 + 1;
    lVar6 = lVar5;
    iVar10 = iVar8;
    if (iVar8 < iVar7) {
      do {
        bVar3 = goodpos(local_100,x,iVar10,&local_a8,entflags);
        iVar7 = local_104;
        lVar9 = lVar6;
        if (bVar3 != '\0') {
          local_f8[lVar6] = (xchar)x;
          local_f8[lVar6 + 1] = (xchar)iVar10;
          lVar5 = lVar6 + 2;
          lVar9 = lVar5;
          if (lVar6 == 0x1c) goto LAB_002597c7;
        }
        iVar10 = iVar10 + 1;
        lVar6 = lVar9;
      } while (iVar10 < local_108);
      pxVar11 = local_f8 + lVar9;
      lVar5 = lVar9;
      if (iVar8 < local_108) {
        do {
          bVar3 = goodpos(local_100,iVar7,iVar8,&local_a8,entflags);
          lVar5 = lVar9;
          if (bVar3 != '\0') {
            *pxVar11 = (xchar)iVar7;
            pxVar11[1] = (xchar)iVar8;
            lVar5 = lVar9 + 2;
            if (lVar9 == 0x1c) goto LAB_002597c7;
          }
          iVar8 = iVar8 + 1;
          pxVar11 = local_f8 + lVar5;
          lVar9 = lVar5;
        } while (iVar8 < local_108);
      }
    }
    else {
      pxVar11 = local_f8 + lVar5;
    }
    if ((int)local_b0 == local_cc) {
      return '\0';
    }
    start_range = (int)local_b0 + 1;
  } while (lVar5 == 0);
LAB_002597cf:
  uVar4 = mt_random();
  lVar6 = SUB168(ZEXT416(uVar4) % SEXT816((long)(int)((ulong)((long)pxVar11 - (long)local_f8) >> 1))
                 ,0);
  local_c8->x = local_f8[lVar6 * 2];
  local_c8->y = local_f8[lVar6 * 2 + 1];
  return '\x01';
LAB_002597c7:
  pxVar11 = local_f8 + lVar5;
  goto LAB_002597cf;
}

Assistant:

boolean enexto_core_range(coord *cc, struct level *lev, xchar xx, xchar yy,
			  const struct permonst *mdat, unsigned entflags,
			  int start_range) /* distance to begin tile check (>= 1) */
{
#define MAX_GOOD 15
    coord good[MAX_GOOD], *good_ptr;
    int x, y, range, i;
    int xmin, xmax, ymin, ymax;
    struct monst fakemon;	/* dummy monster */

    if (!mdat) {
	/* default to player's original monster type */
	mdat = &mons[u.umonster];
    }
    
    fakemon.data = mdat;	/* set up for goodpos */
    good_ptr = good;
    range = start_range;
    /*
     * Walk around the border of the square with center (xx,yy) and
     * radius range.  Stop when we find at least one valid position.
     */
    do {
	xmin = max(1, xx-range);
	xmax = min(COLNO-1, xx+range);
	ymin = max(0, yy-range);
	ymax = min(ROWNO-1, yy+range);

	for (x = xmin; x <= xmax; x++)
	    if (goodpos(lev, x, ymin, &fakemon, entflags)) {
		good_ptr->x = x;
		good_ptr->y = ymin ;
		/* beware of accessing beyond segment boundaries.. */
		if (good_ptr++ == &good[MAX_GOOD-1]) goto full;
	    }
	for (x = xmin; x <= xmax; x++)
	    if (goodpos(lev, x, ymax, &fakemon, entflags)) {
		good_ptr->x = x;
		good_ptr->y = ymax ;
		/* beware of accessing beyond segment boundaries.. */
		if (good_ptr++ == &good[MAX_GOOD-1]) goto full;
	    }
	for (y = ymin+1; y < ymax; y++)
	    if (goodpos(lev, xmin, y, &fakemon, entflags)) {
		good_ptr->x = xmin;
		good_ptr-> y = y ;
		/* beware of accessing beyond segment boundaries.. */
		if (good_ptr++ == &good[MAX_GOOD-1]) goto full;
	    }
	for (y = ymin+1; y < ymax; y++)
	    if (goodpos(lev, xmax, y, &fakemon, entflags)) {
		good_ptr->x = xmax;
		good_ptr->y = y ;
		/* beware of accessing beyond segment boundaries.. */
		if (good_ptr++ == &good[MAX_GOOD-1]) goto full;
	    }
	range++;

	/* return if we've grown too big (nothing is valid) */
	if (range > ROWNO && range > COLNO) return FALSE;
    } while (good_ptr == good);

full:
    i = rn2((int)(good_ptr - good));
    cc->x = good[i].x;
    cc->y = good[i].y;
    return TRUE;
}